

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdvalue.cpp
# Opt level: O1

Am_Wrapper * __thiscall Am_String_Data::Make_Unique(Am_String_Data *this)

{
  uint uVar1;
  Am_String_Data *this_00;
  
  uVar1 = (this->super_Am_Wrapper).refs;
  this_00 = this;
  if (uVar1 != 1) {
    uVar1 = uVar1 - 1;
    (this->super_Am_Wrapper).refs = uVar1;
    if (uVar1 == 0) {
      (*(this->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[4])(this);
    }
    this_00 = (Am_String_Data *)operator_new(0x18);
    Am_String_Data(this_00,this->value,true);
  }
  return &this_00->super_Am_Wrapper;
}

Assistant:

bool
Am_String_Data::operator==(const Am_String_Data &test_value) const
{
  return (this == &test_value) || !strcmp((const char *)test_value, value);
}